

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O2

JPolComponent_VectorImplementation * __thiscall
JPolComponent_VectorImplementation::operator=
          (JPolComponent_VectorImplementation *this,JPolComponent_VectorImplementation *o)

{
  pointer ppPVar1;
  PolicyPureVector *o_00;
  value_type in_RAX;
  PolicyPureVector *pPVar2;
  uint uVar3;
  ulong uVar4;
  value_type local_38;
  
  if (this != o) {
    local_38 = in_RAX;
    if ((long)(this->_m_indivPols_PolicyPureVector).
              super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->_m_indivPols_PolicyPureVector).
              super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)(o->_m_indivPols_PolicyPureVector).
              super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(o->_m_indivPols_PolicyPureVector).
              super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
      ClearIndividualPolicies(this);
      local_38 = (value_type)0x0;
      std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::resize
                (&this->_m_indivPols_PolicyPureVector,
                 (long)(o->_m_indivPols_PolicyPureVector).
                       super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(o->_m_indivPols_PolicyPureVector).
                       super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,&local_38);
    }
    uVar3 = 0;
    while( true ) {
      ppPVar1 = (this->_m_indivPols_PolicyPureVector).
                super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar4 = (ulong)uVar3;
      if ((ulong)((long)(this->_m_indivPols_PolicyPureVector).
                        super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar4)
      break;
      pPVar2 = ppPVar1[uVar4];
      o_00 = (o->_m_indivPols_PolicyPureVector).
             super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
      if (pPVar2 == (PolicyPureVector *)0x0) {
        pPVar2 = (PolicyPureVector *)operator_new(0x50);
        PolicyPureVector::PolicyPureVector(pPVar2,o_00);
        (this->_m_indivPols_PolicyPureVector).
        super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = pPVar2;
      }
      else {
        (**(code **)(*(long *)&(pPVar2->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy
                    + 0x48))(pPVar2,o_00);
      }
      uVar3 = uVar3 + 1;
    }
  }
  return this;
}

Assistant:

JPolComponent_VectorImplementation& JPolComponent_VectorImplementation::operator= (const JPolComponent_VectorImplementation& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...

    //we delete the PolicyPureVectors pointed to: 
    //this means that we should not be able 
    //to add indiv. policies without copying them!!! 
    size_t s = _m_indivPols_PolicyPureVector.size() ;
    if( s != o._m_indivPols_PolicyPureVector.size() )
    {
        ClearIndividualPolicies();
        _m_indivPols_PolicyPureVector.resize( 
                o._m_indivPols_PolicyPureVector.size(), 0);
    }
    
    for(Index i=0; i < _m_indivPols_PolicyPureVector.size() ; i++)
    {
        PolicyPureVector* o_pol = o._m_indivPols_PolicyPureVector[i];
        PolicyPureVector* this_pol =   this->_m_indivPols_PolicyPureVector[i];     
        if(this_pol == 0) // this->_m_indivPols_PolicyPureVector[i] == 0
        {
            //this pol is not a jppv yet, so we need to copy
            PolicyPureVector* copy =  new PolicyPureVector(*o_pol);
            this->_m_indivPols_PolicyPureVector[i] = copy;
        }
        else
        {
            //this_pol is an existing ppv: do assignment.
            (*this_pol) = (*o_pol);
        }
    }
    return *this;
}